

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

CppDirective cpp_directive(Env *env)

{
  _Bool _Var1;
  uint32_t start;
  uint uVar2;
  CppDirective CVar3;
  
  _Var1 = char0(env,0x23);
  if (_Var1) {
    start = advance_while(env,1,is_space_char);
    _Var1 = any_token_from(env,3,cpp_tokens_start,start);
    if (_Var1) {
      return CppStart;
    }
    _Var1 = any_token_from(env,4,cpp_tokens_else,start);
    if (_Var1) {
      return CppElse;
    }
    _Var1 = token_from(env,"endif",start);
    if (_Var1) {
      return CppEnd;
    }
    _Var1 = any_token_from(env,7,cpp_tokens_other,start);
    if ((!_Var1) &&
       ((uVar2 = peek(env,start), 0xd < uVar2 || ((0x3400U >> (uVar2 & 0x1f) & 1) == 0)))) {
      _Var1 = char1(env,0x21);
      if (!_Var1) goto LAB_001097cb;
      if ((env->state->contexts).size != 0) {
        return CppNothing;
      }
    }
    CVar3 = CppOther;
  }
  else {
LAB_001097cb:
    CVar3 = CppNothing;
  }
  return CVar3;
}

Assistant:

static CppDirective cpp_directive(Env *env) {
  if (!char0(env, '#')) return CppNothing;
  uint32_t start = take_space_from(env, 1);
  if (cpp_cond_start(env, start)) return CppStart;
  else if (cpp_cond_else(env, start)) return CppElse;
  else if (cpp_cond_end(env, start)) return CppEnd;
  else if (cpp_directive_other(env, start)) return CppOther;
  else return CppNothing;
}